

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O1

Abc_Cex_t * Pdr_ManDeriveCexAbs(Pdr_Man_t *p)

{
  int nRealPis;
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  Pdr_Set_t *pPVar6;
  Abc_Cex_t *pAVar7;
  Gia_Man_t *p_00;
  Abc_Cex_t *p_01;
  int iVar8;
  int iVar9;
  int iVar10;
  Pdr_Obl_t *pPVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int nFrames;
  
  if ((p->pPars->fUseAbs != 0) && (pVVar1 = p->vMapPpi2Ff, pVVar1 != (Vec_Int_t *)0x0)) {
    nRealPis = p->pAig->nTruePis;
    if (0 < pVVar1->nSize) {
      piVar2 = pVVar1->pArray;
      pVVar3 = p->vMapFf2Ppi;
      uVar13 = 0;
      do {
        lVar14 = (long)piVar2[uVar13];
        if ((lVar14 < 0) || (pVVar3->nSize <= piVar2[uVar13])) goto LAB_005f048e;
        piVar4 = pVVar3->pArray;
        if (uVar13 != (uint)piVar4[lVar14]) {
          __assert_fail("Vec_IntEntry( p->vMapFf2Ppi, Flop ) == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                        ,0x1cf,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
        }
        piVar4[lVar14] = -1;
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)pVVar1->nSize);
    }
    pVVar1->nSize = 0;
    nFrames = 0;
    for (pPVar11 = p->pQueue; pPVar11 != (Pdr_Obl_t *)0x0; pPVar11 = pPVar11->pNext) {
      pPVar6 = pPVar11->pState;
      lVar14 = (long)pPVar6->nLits;
      if (pPVar6->nLits < pPVar6->nTotal) {
        do {
          if ((int)*(uint *)(&pPVar6->field_0x14 + lVar14 * 4) < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar12 = *(uint *)(&pPVar6->field_0x14 + lVar14 * 4) >> 1;
          if (nRealPis <= (int)uVar12) {
            uVar12 = uVar12 - nRealPis;
            if (((int)uVar12 < 0) || (p->vMapFf2Ppi->nSize <= (int)uVar12)) goto LAB_005f048e;
            piVar2 = p->vMapFf2Ppi->pArray;
            if (piVar2[uVar12] < 0) {
              pVVar1 = p->vMapPpi2Ff;
              piVar2[uVar12] = pVVar1->nSize;
              Vec_IntPush(pVVar1,uVar12);
            }
          }
          lVar14 = lVar14 + 1;
          pPVar6 = pPVar11->pState;
        } while (lVar14 < pPVar6->nTotal);
      }
      nFrames = nFrames + 1;
    }
    pVVar1 = p->vMapPpi2Ff;
    iVar5 = pVVar1->nSize;
    if (iVar5 != 0) {
      if (p->pPars->fUseSimpleRef != 0) {
        if (0 < pVVar1->nSize) {
          piVar2 = pVVar1->pArray;
          pVVar3 = p->vAbsFlops;
          lVar14 = 0;
          do {
            lVar15 = (long)piVar2[lVar14];
            if ((lVar15 < 0) || (pVVar3->nSize <= piVar2[lVar14])) {
LAB_005f048e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            piVar4 = pVVar3->pArray;
            if (piVar4[lVar15] != 0) {
              __assert_fail("Vec_IntEntry(p->vAbsFlops, Flop) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                            ,0x1ea,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
            }
            piVar4[lVar15] = 1;
            lVar14 = lVar14 + 1;
          } while (lVar14 < pVVar1->nSize);
        }
LAB_005f0453:
        p->nCexesTotal = p->nCexesTotal + 1;
        p->nCexes = p->nCexes + 1;
        return (Abc_Cex_t *)0x0;
      }
      pAVar7 = Abc_CexAlloc(p->pAig->nRegs - iVar5,iVar5 + p->pAig->nTruePis,nFrames);
      pAVar7->iPo = p->iOutCur;
      pAVar7->iFrame = nFrames + -1;
      iVar5 = 0;
      for (pPVar11 = p->pQueue; pPVar11 != (Pdr_Obl_t *)0x0; pPVar11 = pPVar11->pNext) {
        pPVar6 = pPVar11->pState;
        lVar14 = (long)pPVar6->nLits;
        if (pPVar6->nLits < pPVar6->nTotal) {
          do {
            uVar12 = *(uint *)(&pPVar6->field_0x14 + lVar14 * 4);
            if ((int)uVar12 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((uVar12 & 1) == 0) {
              uVar12 = uVar12 >> 1;
              if ((int)uVar12 < nRealPis) {
                iVar8 = uVar12 + pAVar7->nRegs + pAVar7->nPis * iVar5;
              }
              else {
                uVar12 = uVar12 - nRealPis;
                if (((int)uVar12 < 0) || (p->vMapFf2Ppi->nSize <= (int)uVar12)) goto LAB_005f048e;
                iVar8 = p->vMapFf2Ppi->pArray[uVar12] + nRealPis;
                if (pAVar7->nPis <= iVar8) {
                  __assert_fail("iPPI < pCex->nPis",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                                ,0x200,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
                }
                iVar8 = pAVar7->nPis * iVar5 + iVar8 + pAVar7->nRegs;
              }
              (&pAVar7[1].iPo)[iVar8 >> 5] =
                   (&pAVar7[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < pPVar6->nTotal);
        }
        iVar5 = iVar5 + 1;
      }
      if (iVar5 != nFrames) {
        __assert_fail("f == nFrames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                      ,0x204,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
      }
      p_00 = Gia_ManDupAbs(p->pGia,p->vMapPpi2Ff,p->vMapFf2Ppi);
      p_01 = Bmc_CexCareMinimizeAig(p_00,nRealPis,pAVar7,1,0,0);
      Gia_ManStop(p_00);
      if (p_01->nPis != pAVar7->nPis) {
        __assert_fail("pCexCare->nPis == pCex->nPis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                      ,0x209,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
      }
      Abc_CexFree(pAVar7);
      if (nFrames == 0) {
        Abc_CexFree(p_01);
      }
      else {
        iVar8 = 0;
        iVar5 = 0;
        do {
          iVar10 = p_01->nPis;
          if (nRealPis < iVar10) {
            lVar14 = 0;
            do {
              iVar9 = (int)lVar14;
              uVar12 = iVar10 * iVar5 + p_01->nRegs + nRealPis + iVar9;
              if (((uint)(&p_01[1].iPo)[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) != 0) {
                if ((iVar9 < 0) || (p->vMapPpi2Ff->nSize <= iVar9)) goto LAB_005f048e;
                iVar10 = p->vMapPpi2Ff->pArray[lVar14];
                lVar15 = (long)iVar10;
                if ((lVar15 < 0) || (p->vAbsFlops->nSize <= iVar10)) goto LAB_005f048e;
                piVar2 = p->vAbsFlops->pArray;
                if (piVar2[lVar15] == 0) {
                  piVar2[lVar15] = 1;
                  iVar8 = iVar8 + 1;
                }
              }
              iVar10 = p_01->nPis;
              lVar14 = lVar14 + 1;
            } while (nRealPis + (int)lVar14 < iVar10);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != nFrames);
        Abc_CexFree(p_01);
        if (iVar8 != 0) goto LAB_005f0453;
      }
    }
  }
  pAVar7 = Pdr_ManDeriveCex(p);
  return pAVar7;
}

Assistant:

Abc_Cex_t * Pdr_ManDeriveCexAbs( Pdr_Man_t * p )
{
    extern Gia_Man_t * Gia_ManDupAbs( Gia_Man_t * p, Vec_Int_t * vMapPpi2Ff, Vec_Int_t * vMapFf2Ppi );

    Gia_Man_t * pAbs;
    Abc_Cex_t * pCex, * pCexCare;
    Pdr_Obl_t * pObl;
    int i, f, Lit, Flop, nFrames = 0;
    int nPis = Saig_ManPiNum(p->pAig);
    int nFfRefined = 0;
    if ( !p->pPars->fUseAbs || !p->vMapPpi2Ff )
        return Pdr_ManDeriveCex(p);
    // restore previous map
    Vec_IntForEachEntry( p->vMapPpi2Ff, Flop, i )
    {
        assert( Vec_IntEntry( p->vMapFf2Ppi, Flop ) == i );
        Vec_IntWriteEntry( p->vMapFf2Ppi, Flop, -1 );
    }
    Vec_IntClear( p->vMapPpi2Ff );
    // count the number of frames
    for ( pObl = p->pQueue; pObl; pObl = pObl->pNext )
    {
        for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
        {
            Lit = pObl->pState->Lits[i]; 
            if ( Abc_Lit2Var(Lit) < nPis ) // PI literal
                continue;
            Flop = Abc_Lit2Var(Lit) - nPis;
            if ( Vec_IntEntry(p->vMapFf2Ppi, Flop) >= 0 ) // already used PPI literal
                continue;
            Vec_IntWriteEntry( p->vMapFf2Ppi, Flop, Vec_IntSize(p->vMapPpi2Ff) );
            Vec_IntPush( p->vMapPpi2Ff, Flop );
        }
        nFrames++;
    }
    if ( Vec_IntSize(p->vMapPpi2Ff) == 0 ) // no PPIs -- this is a real CEX
        return Pdr_ManDeriveCex(p);
    if ( p->pPars->fUseSimpleRef )
    {
        // rely on ternary simulation to perform refinement
        Vec_IntForEachEntry( p->vMapPpi2Ff, Flop, i )
        {
            assert( Vec_IntEntry(p->vAbsFlops, Flop) == 0 );
            Vec_IntWriteEntry( p->vAbsFlops, Flop, 1 );
            nFfRefined++;
        }
    }
    else
    {
        // create the counter-example
        pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig) - Vec_IntSize(p->vMapPpi2Ff), Saig_ManPiNum(p->pAig) + Vec_IntSize(p->vMapPpi2Ff), nFrames );
        pCex->iPo    = p->iOutCur;
        pCex->iFrame = nFrames-1;
        for ( pObl = p->pQueue, f = 0; pObl; pObl = pObl->pNext, f++ )
            for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
            {
                Lit = pObl->pState->Lits[i];
                if ( Abc_LitIsCompl(Lit) )
                    continue;
                if ( Abc_Lit2Var(Lit) < nPis ) // PI literal
                    Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Abc_Lit2Var(Lit) );
                else
                {
                    int iPPI = nPis + Vec_IntEntry(p->vMapFf2Ppi, Abc_Lit2Var(Lit) - nPis);
                    assert( iPPI < pCex->nPis );
                    Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + iPPI );
                }
            }
        assert( f == nFrames );
        // perform CEX minimization
        pAbs = Gia_ManDupAbs( p->pGia, p->vMapPpi2Ff, p->vMapFf2Ppi );
        pCexCare = Bmc_CexCareMinimizeAig( pAbs, nPis, pCex, 1, 0, 0 );
        Gia_ManStop( pAbs );
        assert( pCexCare->nPis == pCex->nPis );
        Abc_CexFree( pCex );
        // detect care PPIs
        for ( f = 0; f < nFrames; f++ )
        {
            for ( i = nPis; i < pCexCare->nPis; i++ )
                if ( Abc_InfoHasBit(pCexCare->pData, pCexCare->nRegs + pCexCare->nPis * f + i) )
                {
                    if ( Vec_IntEntry(p->vAbsFlops, Vec_IntEntry(p->vMapPpi2Ff, i-nPis)) == 0 ) // currently abstracted
                        Vec_IntWriteEntry( p->vAbsFlops, Vec_IntEntry(p->vMapPpi2Ff, i-nPis), 1 ), nFfRefined++;
                }
        }
        Abc_CexFree( pCexCare );
        if ( nFfRefined == 0 ) // no refinement -- this is a real CEX
            return Pdr_ManDeriveCex(p);
    }
    //printf( "CEX-based refinement refined %d flops.\n", nFfRefined );
    p->nCexesTotal++;
    p->nCexes++;
    return NULL;
}